

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O0

void __thiscall
dynet::SimpleRNNBuilder::SimpleRNNBuilder
          (SimpleRNNBuilder *this,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model,bool support_lags)

{
  initializer_list<dynet::Parameter> __l;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  Parameter PVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  Dim *in_R8;
  byte in_R9B;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  Parameter p_hb;
  Parameter p_h2h;
  Parameter p_x2h;
  uint i;
  uint layer_input_dim;
  Parameter in_stack_fffffffffffffc38;
  ParameterCollection *in_stack_fffffffffffffc40;
  value_type *in_stack_fffffffffffffc48;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *this_00;
  allocator_type *__a;
  Parameter this_01;
  allocator *paVar2;
  ParameterCollection *in_stack_fffffffffffffc80;
  undefined8 *puVar3;
  Device *device;
  string *p_name;
  undefined8 *puVar4;
  Dim *d;
  ParameterCollection *this_02;
  undefined1 local_319 [33];
  undefined4 local_2f8 [2];
  undefined4 *local_2f0;
  undefined8 local_2e8;
  ParameterStorage *local_2b8;
  undefined1 local_2a9 [25];
  undefined1 *local_290;
  undefined8 local_288;
  allocator local_261;
  string local_260 [52];
  undefined4 local_22c;
  undefined4 *local_228;
  undefined8 local_220;
  ParameterStorage *local_1f0;
  allocator local_1e1;
  Dim *in_stack_fffffffffffffe20;
  ParameterCollection *in_stack_fffffffffffffe28;
  size_type in_stack_fffffffffffffe30;
  Device *in_stack_fffffffffffffe38;
  undefined4 uVar5;
  undefined4 uVar6;
  ParameterInit *init;
  Dim *d_00;
  ParameterCollection *in_stack_fffffffffffffe58;
  allocator local_171;
  string local_170 [32];
  undefined4 local_150 [2];
  undefined4 *local_148;
  undefined8 local_140;
  ParameterStorage *local_110;
  uint local_104;
  undefined4 local_100;
  undefined1 local_f9 [216];
  byte local_21;
  Dim *local_20;
  undefined4 local_14;
  undefined4 local_10;
  uint local_c;
  
  local_21 = in_R9B & 1;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  RNNBuilder::RNNBuilder((RNNBuilder *)in_stack_fffffffffffffc40);
  *in_RDI = &PTR__SimpleRNNBuilder_01049058;
  std::
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ::vector((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
            *)0xd5b164);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
            *)0xd5b17d);
  ParameterCollection::ParameterCollection(in_stack_fffffffffffffc80);
  p_name = (string *)(in_RDI + 0x20);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
            *)0xd5b1b1);
  puVar4 = in_RDI + 0x23;
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0xd5b1ca);
  *(uint *)(in_RDI + 0x26) = local_c;
  *(byte *)((long)in_RDI + 0x134) = local_21 & 1;
  this_02 = (ParameterCollection *)local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_f9 + 1),"simple-rnn-builder",(allocator *)this_02);
  ParameterCollection::add_subcollection
            (in_stack_fffffffffffffe28,(string *)in_stack_fffffffffffffe20);
  ParameterCollection::operator=
            (in_stack_fffffffffffffc40,(ParameterCollection *)in_stack_fffffffffffffc38.p);
  ParameterCollection::~ParameterCollection(in_stack_fffffffffffffc40);
  std::__cxx11::string::~string((string *)(local_f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f9);
  local_100 = local_10;
  d = local_20;
  for (local_104 = 0; local_104 < local_c; local_104 = local_104 + 1) {
    device = (Device *)(in_RDI + 0xc);
    local_150[0] = local_14;
    local_150[1] = local_100;
    local_148 = local_150;
    local_140 = 2;
    x._M_len = in_stack_fffffffffffffe30;
    x._M_array = (iterator)in_stack_fffffffffffffe28;
    Dim::Dim(in_stack_fffffffffffffe20,x);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,"",&local_171);
    local_110 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (this_02,d,(float)((ulong)puVar4 >> 0x20),p_name,device);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    puVar3 = in_RDI + 0xc;
    init = (ParameterInit *)&stack0xfffffffffffffe40;
    d_00 = (Dim *)0x2;
    x_00._M_len = in_stack_fffffffffffffe30;
    x_00._M_array = (iterator)in_stack_fffffffffffffe28;
    uVar5 = local_14;
    uVar6 = local_14;
    Dim::Dim(in_stack_fffffffffffffe20,x_00);
    paVar2 = &local_1e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe20,"",paVar2);
    PVar1 = ParameterCollection::add_parameters
                      (this_02,d,(float)((ulong)puVar4 >> 0x20),p_name,device);
    this_01 = PVar1;
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe20);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    __a = (allocator_type *)(in_RDI + 0xc);
    local_22c = local_14;
    local_228 = &local_22c;
    local_220 = 1;
    x_01._M_len = in_stack_fffffffffffffe30;
    x_01._M_array = (iterator)in_stack_fffffffffffffe28;
    Dim::Dim(in_stack_fffffffffffffe20,x_01);
    ParameterInitConst::ParameterInitConst
              ((ParameterInitConst *)in_stack_fffffffffffffc40,
               (float)((ulong)in_stack_fffffffffffffc38.p >> 0x20));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,"",&local_261);
    local_1f0 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffffe58,d_00,init,(string *)CONCAT44(uVar6,uVar5),
                           in_stack_fffffffffffffe38);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    ParameterInitConst::~ParameterInitConst((ParameterInitConst *)0xd5b58e);
    local_2a9._1_8_ = local_110;
    local_2a9._17_8_ = local_1f0;
    local_290 = local_2a9 + 1;
    local_288 = 3;
    this_00 = (vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)local_2a9;
    local_2a9._9_8_ = PVar1;
    std::allocator<dynet::Parameter>::allocator((allocator<dynet::Parameter> *)0xd5b5ec);
    __l._M_len = (size_type)puVar3;
    __l._M_array = (iterator)paVar2;
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
              ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)this_01.p,__l,__a);
    std::allocator<dynet::Parameter>::~allocator((allocator<dynet::Parameter> *)0xd5b61d);
    if ((*(byte *)((long)in_RDI + 0x134) & 1) != 0) {
      in_stack_fffffffffffffc48 = (value_type *)(in_RDI + 0xc);
      local_2f8[0] = local_14;
      local_2f8[1] = local_14;
      local_2f0 = local_2f8;
      local_2e8 = 2;
      x_02._M_len = in_stack_fffffffffffffe30;
      x_02._M_array = (iterator)in_stack_fffffffffffffe28;
      Dim::Dim(in_stack_fffffffffffffe20,x_02);
      in_stack_fffffffffffffc40 = (ParameterCollection *)local_319;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_319 + 1),"",(allocator *)in_stack_fffffffffffffc40);
      in_stack_fffffffffffffc38 =
           ParameterCollection::add_parameters
                     (this_02,d,(float)((ulong)puVar4 >> 0x20),p_name,device);
      local_2b8 = in_stack_fffffffffffffc38.p;
      std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::push_back
                ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)
                 in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38.p);
      std::__cxx11::string::~string((string *)(local_319 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_319);
    }
    std::
    vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
    ::push_back((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                 *)this_00,in_stack_fffffffffffffc48);
    local_100 = local_14;
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::~vector(this_00);
  }
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  return;
}

Assistant:

SimpleRNNBuilder::SimpleRNNBuilder(unsigned layers,
                       unsigned input_dim,
                       unsigned hidden_dim,
                       ParameterCollection& model,
                       bool support_lags) : layers(layers), lagging(support_lags) {
  local_model = model.add_subcollection("simple-rnn-builder");
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    Parameter p_x2h = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2h = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_hb = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    vector<Parameter> ps = {p_x2h, p_h2h, p_hb};
    if (lagging)
        ps.push_back(local_model.add_parameters({hidden_dim, hidden_dim}));
    params.push_back(ps);
    layer_input_dim = hidden_dim;
  }
  dropout_rate = 0.f;
}